

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

unsigned_long ENTROPY_DEBUG(char *label,unsigned_long entropy)

{
  unsigned_long uVar1;
  unsigned_long entropy_local;
  char *label_local;
  
  uVar1 = getDebugLevel("EXPAT_ENTROPY_DEBUG",0);
  if (uVar1 != 0) {
    fprintf(_stderr,"expat: Entropy: %s --> 0x%0*lx (%lu bytes)\n",label,0x10,entropy,8);
  }
  return entropy;
}

Assistant:

static unsigned long
ENTROPY_DEBUG(const char *label, unsigned long entropy) {
  if (getDebugLevel("EXPAT_ENTROPY_DEBUG", 0) >= 1u) {
    fprintf(stderr, "expat: Entropy: %s --> 0x%0*lx (%lu bytes)\n", label,
            (int)sizeof(entropy) * 2, entropy, (unsigned long)sizeof(entropy));
  }
  return entropy;
}